

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.hpp
# Opt level: O3

void __thiscall
SoapySDR::Device::writeSetting<char_const*>
          (Device *this,int direction,size_t channel,string *key,char **value)

{
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  std::__cxx11::string::string((string *)local_48,*value,&local_49);
  (*this->_vptr_Device[0x6a])(this,direction,channel,key,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void SoapySDR::Device::writeSetting(const int direction, const size_t channel, const std::string &key, const Type &value)
{
    this->writeSetting(direction, channel, key, SoapySDR::SettingToString(value));
}